

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classweight.cc
# Opt level: O2

void CLASSWEIGHTS::predict_or_learn<false,0>
               (classweights *cweights,single_learner *base,example *ec)

{
  float fVar1;
  
  fVar1 = classweights::get_class_weight(cweights,(uint32_t)(long)(ec->l).simple.label);
  ec->weight = fVar1 * ec->weight;
  LEARNER::learner<char,_example>::predict(base,ec,0);
  return;
}

Assistant:

static void predict_or_learn(classweights& cweights, LEARNER::single_learner& base, example& ec)
{
  switch (pred_type)
  {
    case prediction_type::scalar:
      ec.weight *= cweights.get_class_weight((uint32_t)ec.l.simple.label);
      break;
    case prediction_type::multiclass:
      ec.weight *= cweights.get_class_weight(ec.l.multi.label);
      break;
    default:
      // suppress the warning
      break;
  }

  if (is_learn)
    base.learn(ec);
  else
    base.predict(ec);
}